

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clock_updates.cc
# Opt level: O3

void __thiscall
tchecker::clock_updates_list_t::absorbing_merge(clock_updates_list_t *this,clock_updates_list_t *l)

{
  undefined4 *puVar1;
  undefined8 *puVar2;
  __normal_iterator<const_tchecker::clock_update_t_*,_std::vector<tchecker::clock_update_t,_std::allocator<tchecker::clock_update_t>_>_>
  __first;
  __normal_iterator<const_tchecker::clock_update_t_*,_std::vector<tchecker::clock_update_t,_std::allocator<tchecker::clock_update_t>_>_>
  __last;
  pointer pcVar3;
  pointer pcVar4;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var5;
  undefined8 uVar6;
  undefined8 uVar7;
  element_type *peVar8;
  size_type __n;
  clock_update_t *pcVar9;
  clock_update_t *pcVar10;
  clock_update_t *pcVar11;
  long lVar12;
  ulong uVar13;
  long lVar14;
  size_type __n_00;
  pointer pcVar15;
  __normal_iterator<const_tchecker::clock_update_t_*,_std::vector<tchecker::clock_update_t,_std::allocator<tchecker::clock_update_t>_>_>
  __first_00;
  clock_update_t *pcVar16;
  
  pcVar16 = (this->_list).
            super__Vector_base<tchecker::clock_update_t,_std::allocator<tchecker::clock_update_t>_>.
            _M_impl.super__Vector_impl_data._M_finish;
  if ((this->_list).
      super__Vector_base<tchecker::clock_update_t,_std::allocator<tchecker::clock_update_t>_>.
      _M_impl.super__Vector_impl_data._M_start == pcVar16) {
    pcVar3 = (this->_list).
             super__Vector_base<tchecker::clock_update_t,_std::allocator<tchecker::clock_update_t>_>
             ._M_impl.super__Vector_impl_data._M_start;
    pcVar4 = (this->_list).
             super__Vector_base<tchecker::clock_update_t,_std::allocator<tchecker::clock_update_t>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    pcVar15 = pcVar3;
    if (pcVar4 != pcVar3) {
      do {
        p_Var5 = (pcVar15->_value).
                 super___shared_ptr<const_tchecker::expression_t,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi;
        if (p_Var5 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var5);
        }
        pcVar15 = pcVar15 + 1;
      } while (pcVar15 != pcVar4);
      (this->_list).
      super__Vector_base<tchecker::clock_update_t,_std::allocator<tchecker::clock_update_t>_>.
      _M_impl.super__Vector_impl_data._M_finish = pcVar3;
    }
    return;
  }
  __first._M_current =
       (l->_list).
       super__Vector_base<tchecker::clock_update_t,_std::allocator<tchecker::clock_update_t>_>.
       _M_impl.super__Vector_impl_data._M_start;
  __last._M_current =
       (l->_list).
       super__Vector_base<tchecker::clock_update_t,_std::allocator<tchecker::clock_update_t>_>.
       _M_impl.super__Vector_impl_data._M_finish;
  if (__first._M_current == __last._M_current) {
    std::vector<tchecker::clock_update_t,_std::allocator<tchecker::clock_update_t>_>::clear
              (&this->_list);
    return;
  }
  if (__first._M_current != __last._M_current) {
    uVar13 = (long)__last._M_current - (long)__first._M_current;
    lVar14 = (long)uVar13 >> 3;
    __n_00 = lVar14 * -0x5555555555555555;
    pcVar9 = (this->_list).
             super__Vector_base<tchecker::clock_update_t,_std::allocator<tchecker::clock_update_t>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    if (uVar13 <= (ulong)((long)(this->_list).
                                super__Vector_base<tchecker::clock_update_t,_std::allocator<tchecker::clock_update_t>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)pcVar9))
    {
      lVar12 = (long)pcVar9 - (long)pcVar16 >> 3;
      if (__n_00 < (ulong)(lVar12 * -0x5555555555555555)) {
        lVar12 = 0;
        do {
          *(undefined4 *)((long)&pcVar9->_clock_id + lVar12) =
               *(undefined4 *)((long)pcVar9 + lVar12 + lVar14 * -8);
          *(undefined8 *)
           ((long)&(pcVar9->_value).
                   super___shared_ptr<const_tchecker::expression_t,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi + lVar12) = 0;
          puVar2 = (undefined8 *)((long)pcVar9 + lVar12 + lVar14 * -8 + 8);
          uVar6 = *puVar2;
          uVar7 = puVar2[1];
          *(undefined8 *)((long)pcVar9 + lVar12 + lVar14 * -8 + 0x10) = 0;
          puVar2 = (undefined8 *)
                   ((long)&(pcVar9->_value).
                           super___shared_ptr<const_tchecker::expression_t,_(__gnu_cxx::_Lock_policy)2>
                           ._M_ptr + lVar12);
          *puVar2 = uVar6;
          puVar2[1] = uVar7;
          *(undefined8 *)((long)pcVar9 + lVar12 + lVar14 * -8 + 8) = 0;
          lVar12 = lVar12 + 0x18;
        } while (lVar12 != lVar14 * 8);
        (this->_list).
        super__Vector_base<tchecker::clock_update_t,_std::allocator<tchecker::clock_update_t>_>.
        _M_impl.super__Vector_impl_data._M_finish = (pointer)(uVar13 + (long)pcVar9);
        std::__copy_move_backward<true,false,std::random_access_iterator_tag>::
        __copy_move_b<tchecker::clock_update_t*,tchecker::clock_update_t*>
                  (pcVar16,(clock_update_t *)((long)pcVar9 + lVar14 * -8),pcVar9);
        __first_00._M_current = __last._M_current;
      }
      else {
        __first_00._M_current = ((long)pcVar9 - (long)pcVar16) + __first._M_current;
        std::__uninitialized_copy<false>::
        __uninit_copy<__gnu_cxx::__normal_iterator<tchecker::clock_update_t_const*,std::vector<tchecker::clock_update_t,std::allocator<tchecker::clock_update_t>>>,tchecker::clock_update_t*>
                  (__first_00,__last,pcVar9);
        pcVar4 = (this->_list).
                 super__Vector_base<tchecker::clock_update_t,_std::allocator<tchecker::clock_update_t>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
        pcVar3 = pcVar4 + __n_00 + lVar12 * 0x5555555555555555;
        (this->_list).
        super__Vector_base<tchecker::clock_update_t,_std::allocator<tchecker::clock_update_t>_>.
        _M_impl.super__Vector_impl_data._M_finish = pcVar3;
        if (pcVar9 != pcVar16) {
          lVar14 = 0;
          do {
            puVar1 = (undefined4 *)((long)&pcVar16->_clock_id + lVar14);
            *(undefined4 *)((long)&pcVar3->_clock_id + lVar14) = *puVar1;
            *(undefined8 *)
             ((long)&(pcVar3->_value).
                     super___shared_ptr<const_tchecker::expression_t,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi + lVar14) = 0;
            uVar6 = *(undefined8 *)(puVar1 + 4);
            *(undefined8 *)(puVar1 + 4) = 0;
            puVar2 = (undefined8 *)
                     ((long)&(pcVar3->_value).
                             super___shared_ptr<const_tchecker::expression_t,_(__gnu_cxx::_Lock_policy)2>
                             ._M_ptr + lVar14);
            *puVar2 = *(undefined8 *)(puVar1 + 2);
            puVar2[1] = uVar6;
            *(undefined8 *)(puVar1 + 2) = 0;
            lVar14 = lVar14 + 0x18;
          } while ((clock_update_t *)(puVar1 + 6) != pcVar9);
        }
        (this->_list).
        super__Vector_base<tchecker::clock_update_t,_std::allocator<tchecker::clock_update_t>_>.
        _M_impl.super__Vector_impl_data._M_finish = (pointer)((long)pcVar4 + uVar13);
      }
      std::__copy_move<false,false,std::random_access_iterator_tag>::
      __copy_m<tchecker::clock_update_t_const*,tchecker::clock_update_t*>
                (__first._M_current,__first_00._M_current,pcVar16);
      return;
    }
    __n = std::vector<tchecker::clock_update_t,_std::allocator<tchecker::clock_update_t>_>::
          _M_check_len(&this->_list,__n_00,"vector::_M_range_insert");
    if (__n == 0) {
      pcVar9 = (clock_update_t *)0x0;
    }
    else {
      pcVar9 = __gnu_cxx::new_allocator<tchecker::clock_update_t>::allocate
                         ((new_allocator<tchecker::clock_update_t> *)this,__n,(void *)0x0);
    }
    pcVar11 = pcVar9;
    for (pcVar10 = (this->_list).
                   super__Vector_base<tchecker::clock_update_t,_std::allocator<tchecker::clock_update_t>_>
                   ._M_impl.super__Vector_impl_data._M_start; pcVar10 != pcVar16;
        pcVar10 = pcVar10 + 1) {
      pcVar11->_clock_id = pcVar10->_clock_id;
      (pcVar11->_value).super___shared_ptr<const_tchecker::expression_t,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      peVar8 = (pcVar10->_value).
               super___shared_ptr<const_tchecker::expression_t,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      p_Var5 = (pcVar10->_value).
               super___shared_ptr<const_tchecker::expression_t,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi;
      (pcVar10->_value).super___shared_ptr<const_tchecker::expression_t,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      (pcVar11->_value).super___shared_ptr<const_tchecker::expression_t,_(__gnu_cxx::_Lock_policy)2>
      ._M_ptr = peVar8;
      (pcVar11->_value).super___shared_ptr<const_tchecker::expression_t,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi = p_Var5;
      (pcVar10->_value).super___shared_ptr<const_tchecker::expression_t,_(__gnu_cxx::_Lock_policy)2>
      ._M_ptr = (element_type *)0x0;
      pcVar11 = pcVar11 + 1;
    }
    pcVar11 = std::__uninitialized_copy<false>::
              __uninit_copy<__gnu_cxx::__normal_iterator<tchecker::clock_update_t_const*,std::vector<tchecker::clock_update_t,std::allocator<tchecker::clock_update_t>>>,tchecker::clock_update_t*>
                        (__first,__last,pcVar11);
    pcVar10 = (this->_list).
              super__Vector_base<tchecker::clock_update_t,_std::allocator<tchecker::clock_update_t>_>
              ._M_impl.super__Vector_impl_data._M_finish;
    for (; pcVar10 != pcVar16; pcVar16 = pcVar16 + 1) {
      pcVar11->_clock_id = pcVar16->_clock_id;
      (pcVar11->_value).super___shared_ptr<const_tchecker::expression_t,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      peVar8 = (pcVar16->_value).
               super___shared_ptr<const_tchecker::expression_t,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      p_Var5 = (pcVar16->_value).
               super___shared_ptr<const_tchecker::expression_t,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi;
      (pcVar16->_value).super___shared_ptr<const_tchecker::expression_t,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      (pcVar11->_value).super___shared_ptr<const_tchecker::expression_t,_(__gnu_cxx::_Lock_policy)2>
      ._M_ptr = peVar8;
      (pcVar11->_value).super___shared_ptr<const_tchecker::expression_t,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi = p_Var5;
      (pcVar16->_value).super___shared_ptr<const_tchecker::expression_t,_(__gnu_cxx::_Lock_policy)2>
      ._M_ptr = (element_type *)0x0;
      pcVar11 = pcVar11 + 1;
    }
    pcVar16 = (this->_list).
              super__Vector_base<tchecker::clock_update_t,_std::allocator<tchecker::clock_update_t>_>
              ._M_impl.super__Vector_impl_data._M_start;
    if (pcVar16 != pcVar10) {
      do {
        p_Var5 = (pcVar16->_value).
                 super___shared_ptr<const_tchecker::expression_t,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi;
        if (p_Var5 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var5);
        }
        pcVar16 = pcVar16 + 1;
      } while (pcVar16 != pcVar10);
      pcVar16 = (this->_list).
                super__Vector_base<tchecker::clock_update_t,_std::allocator<tchecker::clock_update_t>_>
                ._M_impl.super__Vector_impl_data._M_start;
    }
    if (pcVar16 != (clock_update_t *)0x0) {
      operator_delete(pcVar16,(long)(this->_list).
                                    super__Vector_base<tchecker::clock_update_t,_std::allocator<tchecker::clock_update_t>_>
                                    ._M_impl.super__Vector_impl_data._M_end_of_storage -
                              (long)pcVar16);
    }
    (this->_list).
    super__Vector_base<tchecker::clock_update_t,_std::allocator<tchecker::clock_update_t>_>._M_impl.
    super__Vector_impl_data._M_start = pcVar9;
    (this->_list).
    super__Vector_base<tchecker::clock_update_t,_std::allocator<tchecker::clock_update_t>_>._M_impl.
    super__Vector_impl_data._M_finish = pcVar11;
    (this->_list).
    super__Vector_base<tchecker::clock_update_t,_std::allocator<tchecker::clock_update_t>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = pcVar9 + __n;
  }
  return;
}

Assistant:

void clock_updates_list_t::absorbing_merge(tchecker::clock_updates_list_t const & l)
{
  if (empty() || l.empty())
    clear();
  else
    _list.insert(_list.end(), l.begin(), l.end());
}